

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O3

bool UnifiedRegex::CaseInsensitive::RangeToEquivClass
               (uint *tblidx,uint l,uint h,uint *acth,codepoint_t *equivl)

{
  uint uVar1;
  code *pcVar2;
  uint c;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  int i;
  long lVar9;
  
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x1ce,"(l <= h)","l <= h");
    if (!bVar3) {
LAB_00e574ff:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = *tblidx;
  if (uVar1 < 0x16d && l < 0x118e0) {
    uVar5 = (ulong)uVar1;
    uVar7 = uVar1 + 1;
    puVar6 = (uint *)(transforms + uVar5 * 0x1c + 8);
    do {
      if ((l <= *puVar6) && (*(byte *)((long)puVar6 + -7) < 2)) {
        lVar9 = (uVar5 & 0xffffffff) * 0x1c;
        uVar1 = *(uint *)(transforms + lVar9 + 4);
        c = l;
        if (l < uVar1) {
          c = uVar1;
        }
        uVar8 = c;
        if (transforms[lVar9] == '\x01') {
          uVar8 = *(uint *)(transforms + lVar9 + 8);
        }
        if (h <= uVar8) {
          uVar8 = h;
        }
        if (c <= uVar8) {
          if (l < uVar1) {
            *acth = c - 1;
            *equivl = l;
            equivl[1] = l;
            equivl[2] = l;
            equivl[3] = l;
            return false;
          }
          *acth = uVar8;
          Transform::Apply<unsigned_int>((Transform *)(transforms + (ulong)*tblidx * 0x1c),c,equivl)
          ;
          return true;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      *tblidx = uVar7;
      uVar7 = uVar7 + 1;
      puVar6 = puVar6 + 7;
    } while (uVar7 != 0x16e);
  }
  *acth = h;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  lVar9 = 0;
  do {
    if (0x10ffff < l) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xbd,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar3) goto LAB_00e574ff;
      *puVar4 = 0;
    }
    equivl[lVar9] = l;
    lVar9 = lVar9 + 1;
    if (lVar9 == 4) {
      return false;
    }
  } while( true );
}

Assistant:

bool RangeToEquivClass(uint & tblidx, uint l, uint h, uint & acth, __out_ecount(EquivClassSize) codepoint_t equivl[EquivClassSize])
        {
            return RangeToEquivClass(tblidx, l, h, acth, equivl, [](MappingSource source) {
                return source == MappingSource::CaseFolding || source == MappingSource::UnicodeData;
            });
        }